

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::ElementSelectExpression::evalImpl(ElementSelectExpression *this,EvalContext *context)

{
  SourceRange range_00;
  SourceRange range_01;
  bool bVar1;
  undefined1 uVar2;
  ConstantRange *pCVar3;
  Map *pMVar4;
  SourceLocation SVar5;
  iterator iVar6;
  ConstantValue *pCVar7;
  ElementSelectExpression *in_RSI;
  ConstantValue *in_RDI;
  optional<slang::ConstantRange> oVar8;
  bool *in_stack_00000010;
  ConstantValue *in_stack_00000018;
  ConstantValue *in_stack_00000020;
  EvalContext *in_stack_00000028;
  ElementSelectExpression *in_stack_00000030;
  iterator it;
  AssociativeArray *map;
  Type *valType;
  optional<slang::ConstantRange> range;
  ConstantValue associativeIndex;
  bool softFail;
  ConstantValue cv;
  Type *in_stack_fffffffffffffdc8;
  EvalContext *in_stack_fffffffffffffdd0;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *this_00;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  undefined7 in_stack_fffffffffffffe18;
  DiagCode code;
  int32_t in_stack_fffffffffffffed0;
  int32_t in_stack_fffffffffffffed4;
  SVInt *in_stack_fffffffffffffed8;
  ConstantValue *in_stack_fffffffffffffee8;
  int32_t in_stack_fffffffffffffef0;
  int32_t in_stack_fffffffffffffef4;
  ConstantValue *in_stack_fffffffffffffef8;
  _Self local_e0;
  _Self local_d8;
  SourceLocation local_d0;
  span<slang::ConstantValue,_18446744073709551615UL> local_b8;
  Type *local_a8;
  _Storage<slang::ConstantRange,_true> local_a0;
  undefined4 local_98;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_8c;
  byte local_51;
  undefined4 local_50;
  
  value(in_RSI);
  Expression::eval((Expression *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                   in_stack_fffffffffffffdd0);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa51144);
  if (bVar1) {
    local_51 = 0;
    slang::ConstantValue::ConstantValue((ConstantValue *)0xa511b3);
    oVar8 = evalIndex(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                      in_stack_00000010);
    local_a0 = oVar8.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ConstantRange>._M_payload;
    local_98 = CONCAT31(local_98._1_3_,
                        oVar8.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                        super__Optional_payload_base<slang::ConstantRange>._M_engaged);
    local_8c._8_4_ = local_98;
    local_8c._0_8_ = local_a0;
    bVar1 = std::optional::operator_cast_to_bool((optional<slang::ConstantRange> *)0xa5123a);
    if ((bVar1) || (bVar1 = slang::ConstantValue::bad((ConstantValue *)0xa5124f), !bVar1)) {
      value(in_RSI);
      local_a8 = not_null<const_slang::ast::Type_*>::operator*
                           ((not_null<const_slang::ast::Type_*> *)0xa51318);
      bVar1 = Type::hasFixedRange((Type *)in_stack_fffffffffffffdd0);
      if (bVar1) {
        bVar1 = Type::isUnpackedArray(in_stack_fffffffffffffdc8);
        if (bVar1) {
          local_b8 = slang::ConstantValue::elements((ConstantValue *)0xa51388);
          pCVar3 = std::optional<slang::ConstantRange>::operator->
                             ((optional<slang::ConstantRange> *)0xa513c7);
          std::span<slang::ConstantValue,_18446744073709551615UL>::operator[]
                    (&local_b8,(long)pCVar3->left);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffdd0,
                     (ConstantValue *)in_stack_fffffffffffffdc8);
        }
        else {
          slang::ConstantValue::integer((ConstantValue *)0xa51406);
          std::optional<slang::ConstantRange>::operator->
                    ((optional<slang::ConstantRange> *)0xa51422);
          std::optional<slang::ConstantRange>::operator->
                    ((optional<slang::ConstantRange> *)0xa51435);
          SVInt::slice(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0
                      );
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffdd0,(SVInt *)in_stack_fffffffffffffdc8);
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        }
      }
      else {
        bVar1 = Type::isAssociativeArray((Type *)0xa514bd);
        if (bVar1) {
          pMVar4 = slang::ConstantValue::map((ConstantValue *)0xa514dd);
          code = SUB84((ulong)pMVar4 >> 0x20,0);
          SVar5 = (SourceLocation)
                  CopyPtr<slang::AssociativeArray>::operator*
                            ((CopyPtr<slang::AssociativeArray> *)0xa514ee);
          local_d0 = SVar5;
          iVar6 = std::
                  map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                  ::find((map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                          *)in_stack_fffffffffffffdc8,(key_type *)0xa51517);
          local_d8._M_node = iVar6._M_node;
          local_e0._M_node =
               (_Base_ptr)
               std::
               map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
               ::end((map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                      *)in_stack_fffffffffffffdc8);
          bVar1 = std::operator==(&local_d8,&local_e0);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            uVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa515a1);
            if ((bool)uVar2) {
              slang::ConstantValue::ConstantValue
                        ((ConstantValue *)in_stack_fffffffffffffdd0,
                         (ConstantValue *)in_stack_fffffffffffffdc8);
            }
            else {
              selector(in_RSI);
              range_01.endLoc = SVar5;
              range_01.startLoc = (SourceLocation)iVar6._M_node;
              EvalContext::addDiag
                        ((EvalContext *)CONCAT17(uVar2,in_stack_fffffffffffffe18),code,range_01);
              value(in_RSI);
              range_00.startLoc._4_4_ = in_stack_fffffffffffffddc;
              range_00.startLoc._0_4_ = in_stack_fffffffffffffdd8;
              range_00.endLoc._0_4_ = in_stack_fffffffffffffde0;
              range_00.endLoc._4_4_ = in_stack_fffffffffffffde4;
              Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffdd0,range_00);
              Diagnostic::operator<<
                        ((Diagnostic *)in_stack_fffffffffffffdd0,
                         (ConstantValue *)in_stack_fffffffffffffdc8);
              not_null<const_slang::ast::Type_*>::operator->
                        ((not_null<const_slang::ast::Type_*> *)0xa516ac);
              Type::getDefaultValue
                        ((Type *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
            }
          }
          else {
            std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>::
            operator->((_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>
                        *)0xa5156a);
            slang::ConstantValue::ConstantValue
                      ((ConstantValue *)in_stack_fffffffffffffdd0,
                       (ConstantValue *)in_stack_fffffffffffffdc8);
          }
        }
        else {
          bVar1 = Type::isString((Type *)0xa516ea);
          if (bVar1) {
            this_00 = &local_8c;
            std::optional<slang::ConstantRange>::operator->
                      ((optional<slang::ConstantRange> *)0xa5170f);
            std::optional<slang::ConstantRange>::operator->
                      ((optional<slang::ConstantRange> *)0xa5171f);
            slang::ConstantValue::ConstantValue((ConstantValue *)this_00,in_stack_fffffffffffffdc8);
            slang::ConstantValue::getSlice
                      (in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                       ,in_stack_fffffffffffffee8);
            slang::ConstantValue::~ConstantValue((ConstantValue *)0xa5176d);
          }
          else {
            std::optional<slang::ConstantRange>::operator->
                      ((optional<slang::ConstantRange> *)0xa517aa);
            pCVar7 = slang::ConstantValue::at
                               ((ConstantValue *)in_stack_fffffffffffffdd0,
                                (size_t)in_stack_fffffffffffffdc8);
            slang::ConstantValue::ConstantValue((ConstantValue *)in_stack_fffffffffffffdd0,pCVar7);
          }
        }
      }
    }
    else if ((local_51 & 1) == 0) {
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    }
    else {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa51283)
      ;
      Type::getDefaultValue((Type *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    }
    local_50 = 1;
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xa517eb);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    local_50 = 1;
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xa51809);
  return in_RDI;
}

Assistant:

ConstantValue ElementSelectExpression::evalImpl(EvalContext& context) const {
    ConstantValue cv = value().eval(context);
    if (!cv)
        return nullptr;

    bool softFail = false;
    ConstantValue associativeIndex;
    auto range = evalIndex(context, cv, associativeIndex, softFail);
    if (!range && associativeIndex.bad()) {
        if (softFail)
            return type->getDefaultValue();
        else
            return nullptr;
    }

    // Handling for packed and unpacked arrays, all integer types.
    const Type& valType = *value().type;
    if (valType.hasFixedRange()) {
        // For fixed types, we know we will always be in range, so just do the selection.
        if (valType.isUnpackedArray())
            return cv.elements()[size_t(range->left)];
        else
            return cv.integer().slice(range->left, range->right);
    }

    // Handling for associative arrays.
    if (valType.isAssociativeArray()) {
        auto& map = *cv.map();
        if (auto it = map.find(associativeIndex); it != map.end())
            return it->second;

        // If there is a user specified default, return that without warning.
        if (map.defaultValue)
            return map.defaultValue;

        // Otherwise issue a warning and use the default default.
        context.addDiag(diag::ConstEvalAssociativeElementNotFound, selector().sourceRange)
            << value().sourceRange << associativeIndex;
        return type->getDefaultValue();
    }

    // Handling for strings, dynamic arrays, and queues.
    SLANG_ASSERT(range->left == range->right);
    if (valType.isString())
        return cv.getSlice(range->left, range->right, nullptr);

    return std::move(cv).at(size_t(range->left));
}